

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O0

int InitLibrary(DeviceTy *Device)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  reference pp_Var4;
  reference pp_Var5;
  __tgt_target_table *HstPtrBegin;
  void *pvVar6;
  int *in_RDI;
  int rc_1;
  void *ctor;
  void **entry;
  iterator __end4;
  iterator __begin4;
  list<void_*,_std::allocator<void_*>_> *__range4;
  pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy> *lib;
  iterator __end2;
  iterator __begin2;
  PendingCtorsDtorsPerLibrary *__range2;
  __tgt_offload_entry *EntryDeviceEnd;
  __tgt_offload_entry *CurrHostEntry;
  __tgt_offload_entry *CurrDeviceEntry;
  __tgt_target_table *HostTable;
  size_t tsize;
  size_t hsize;
  __tgt_target_table *TargetTable;
  __tgt_device_image *img;
  TranslationTable *TransTable;
  iterator ii;
  int rc;
  int32_t device_id;
  int64_t *in_stack_00000150;
  void **in_stack_00000158;
  void **in_stack_00000160;
  int32_t in_stack_0000016c;
  void *in_stack_00000170;
  int64_t in_stack_00000178;
  int64_t *in_stack_00000190;
  int32_t in_stack_00000198;
  int32_t in_stack_000001a0;
  int in_stack_000001a8;
  map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
  *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  _Self local_d0;
  _Self local_c8;
  PendingCtorDtorListsTy *local_c0;
  reference local_b8;
  _Self local_b0;
  _Self local_a8;
  int *local_a0;
  HostDataToTargetTy local_98;
  __tgt_offload_entry *local_70;
  __tgt_offload_entry *local_68;
  __tgt_offload_entry *local_60;
  TranslationTable *local_58;
  long local_50;
  long local_48;
  __tgt_target_table *local_40;
  value_type local_38;
  TranslationTable *local_30;
  _Self local_28;
  _Self local_20;
  int local_18;
  int local_14;
  int *local_10;
  int local_4;
  
  local_14 = *in_RDI;
  local_18 = 0;
  local_10 = in_RDI;
  std::mutex::lock((mutex *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  std::mutex::lock((mutex *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  local_20._M_node =
       (_Base_ptr)
       std::
       map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
       ::begin((map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
                *)in_stack_fffffffffffffee8);
  do {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
         ::end((map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
                *)in_stack_fffffffffffffee8);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) {
LAB_00113e16:
      std::mutex::unlock((mutex *)0x113e22);
      if (local_18 == 0) {
        bVar1 = std::
                map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
                ::empty((map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
                         *)0x113e64);
        if (!bVar1) {
          local_a0 = local_10 + 0xe;
          local_a8._M_node =
               (_Base_ptr)
               std::
               map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
               ::begin(in_stack_fffffffffffffee8);
          local_b0._M_node =
               (_Base_ptr)
               std::
               map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
               ::end(in_stack_fffffffffffffee8);
          while (bVar1 = std::operator!=(&local_a8,&local_b0), bVar1) {
            local_b8 = std::
                       _Rb_tree_iterator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>
                       ::operator*((_Rb_tree_iterator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>
                                    *)0x113ebd);
            bVar1 = std::__cxx11::list<void_*,_std::allocator<void_*>_>::empty
                              (&(local_b8->second).PendingCtors);
            if (!bVar1) {
              local_c0 = &local_b8->second;
              local_c8._M_node =
                   (_List_node_base *)
                   std::__cxx11::list<void_*,_std::allocator<void_*>_>::begin
                             ((list<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffee8);
              local_d0._M_node =
                   (_List_node_base *)
                   std::__cxx11::list<void_*,_std::allocator<void_*>_>::end
                             ((list<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffee8);
              while (bVar1 = std::operator!=(&local_c8,&local_d0), bVar1) {
                std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)0x113f26);
                in_stack_fffffffffffffee8 =
                     (map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
                      *)0x0;
                in_stack_fffffffffffffef0 = 1;
                iVar2 = target(in_stack_00000178,in_stack_00000170,in_stack_0000016c,
                               in_stack_00000160,in_stack_00000158,in_stack_00000150,
                               in_stack_00000190,in_stack_00000198,in_stack_000001a0,
                               in_stack_000001a8);
                if (iVar2 != 0) {
                  std::mutex::unlock((mutex *)0x113f96);
                  return -1;
                }
                std::_List_iterator<void_*>::operator++(&local_c8);
              }
              std::__cxx11::list<void_*,_std::allocator<void_*>_>::clear
                        ((list<void_*,_std::allocator<void_*>_> *)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
            }
            std::_Rb_tree_iterator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>::
            operator++((_Rb_tree_iterator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>
                        *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
          }
        }
        *(undefined1 *)(local_10 + 7) = 0;
        std::mutex::unlock((mutex *)0x113ff5);
        local_4 = 0;
      }
      else {
        std::mutex::unlock((mutex *)0x113e40);
        local_4 = local_18;
      }
      return local_4;
    }
    ppVar3 = std::_Rb_tree_iterator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>::
             operator->((_Rb_tree_iterator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>
                         *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    local_30 = &ppVar3->second;
    pp_Var4 = std::vector<__tgt_target_table_*,_std::allocator<__tgt_target_table_*>_>::operator[]
                        (&(ppVar3->second).TargetsTable,(long)local_14);
    if (*pp_Var4 == (value_type)0x0) {
      pp_Var5 = std::vector<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_>::operator[]
                          (&local_30->TargetsImages,(long)local_14);
      local_38 = *pp_Var5;
      if (local_38 == (value_type)0x0) {
        local_18 = -1;
        goto LAB_00113e16;
      }
      HstPtrBegin = DeviceTy::load_binary
                              ((DeviceTy *)
                               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                               (void *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                              );
      pp_Var4 = std::vector<__tgt_target_table_*,_std::allocator<__tgt_target_table_*>_>::operator[]
                          (&local_30->TargetsTable,(long)local_14);
      *pp_Var4 = HstPtrBegin;
      local_40 = HstPtrBegin;
      if (HstPtrBegin == (__tgt_target_table *)0x0) {
        pp_Var5 = std::vector<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_>::
                  operator[](&local_30->TargetsImages,(long)local_14);
        *pp_Var5 = (value_type)0x0;
        local_18 = -1;
        goto LAB_00113e16;
      }
      local_48 = (long)(local_30->HostTable).EntriesEnd - (long)(local_30->HostTable).EntriesBegin
                 >> 5;
      local_50 = (long)HstPtrBegin->EntriesEnd - (long)HstPtrBegin->EntriesBegin >> 5;
      if (local_48 != local_50) {
        pp_Var5 = std::vector<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_>::
                  operator[](&local_30->TargetsImages,(long)local_14);
        *pp_Var5 = (value_type)0x0;
        pp_Var4 = std::vector<__tgt_target_table_*,_std::allocator<__tgt_target_table_*>_>::
                  operator[](&local_30->TargetsTable,(long)local_14);
        *pp_Var4 = (value_type)0x0;
        local_18 = -1;
        goto LAB_00113e16;
      }
      std::mutex::lock((mutex *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      local_58 = local_30;
      local_68 = (local_30->HostTable).EntriesBegin;
      local_70 = local_40->EntriesEnd;
      for (local_60 = local_40->EntriesBegin; local_60 != local_70; local_60 = local_60 + 1) {
        if ((local_60->size != 0) &&
           (pvVar6 = DeviceTy::getTgtPtrBegin
                               ((DeviceTy *)
                                CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                HstPtrBegin,(int64_t)in_stack_ffffffffffffff08),
           pvVar6 == (void *)0x0)) {
          in_stack_ffffffffffffff08 = local_10 + 8;
          HostDataToTargetTy::HostDataToTargetTy
                    (&local_98,(uintptr_t)local_68->addr,(uintptr_t)local_68->addr,
                     (long)local_68->addr + local_68->size,(uintptr_t)local_60->addr,
                     0x3fffffffffffffff);
          std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::push_front
                    ((list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     (value_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        }
        local_68 = local_68 + 1;
      }
      std::mutex::unlock((mutex *)0x113e04);
    }
    std::_Rb_tree_iterator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>::operator++
              ((_Rb_tree_iterator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  } while( true );
}

Assistant:

static int InitLibrary(DeviceTy& Device) {
  /*
   * Map global data
   */
  int32_t device_id = Device.DeviceID;
  int rc = OFFLOAD_SUCCESS;

  Device.PendingGlobalsMtx.lock();
  TrlTblMtx.lock();
  for (HostEntriesBeginToTransTableTy::iterator
      ii = HostEntriesBeginToTransTable.begin();
      ii != HostEntriesBeginToTransTable.end(); ++ii) {
    TranslationTable *TransTable = &ii->second;
    if (TransTable->TargetsTable[device_id] != 0) {
      // Library entries have already been processed
      continue;
    }

    // 1) get image.
    assert(TransTable->TargetsImages.size() > (size_t)device_id &&
           "Not expecting a device ID outside the table's bounds!");
    __tgt_device_image *img = TransTable->TargetsImages[device_id];
    if (!img) {
      DP("No image loaded for device id %d.\n", device_id);
      rc = OFFLOAD_FAIL;
      break;
    }
    // 2) load image into the target table.
    __tgt_target_table *TargetTable =
        TransTable->TargetsTable[device_id] = Device.load_binary(img);
    // Unable to get table for this image: invalidate image and fail.
    if (!TargetTable) {
      DP("Unable to generate entries table for device id %d.\n", device_id);
      TransTable->TargetsImages[device_id] = 0;
      rc = OFFLOAD_FAIL;
      break;
    }

    // Verify whether the two table sizes match.
    size_t hsize =
        TransTable->HostTable.EntriesEnd - TransTable->HostTable.EntriesBegin;
    size_t tsize = TargetTable->EntriesEnd - TargetTable->EntriesBegin;

    // Invalid image for these host entries!
    if (hsize != tsize) {
      DP("Host and Target tables mismatch for device id %d [%zx != %zx].\n",
         device_id, hsize, tsize);
      TransTable->TargetsImages[device_id] = 0;
      TransTable->TargetsTable[device_id] = 0;
      rc = OFFLOAD_FAIL;
      break;
    }

    // process global data that needs to be mapped.
    Device.DataMapMtx.lock();
    __tgt_target_table *HostTable = &TransTable->HostTable;
    for (__tgt_offload_entry *CurrDeviceEntry = TargetTable->EntriesBegin,
                             *CurrHostEntry = HostTable->EntriesBegin,
                             *EntryDeviceEnd = TargetTable->EntriesEnd;
         CurrDeviceEntry != EntryDeviceEnd;
         CurrDeviceEntry++, CurrHostEntry++) {
      if (CurrDeviceEntry->size != 0) {
        // has data.
        assert(CurrDeviceEntry->size == CurrHostEntry->size &&
               "data size mismatch");

        // Fortran may use multiple weak declarations for the same symbol,
        // therefore we must allow for multiple weak symbols to be loaded from
        // the fat binary. Treat these mappings as any other "regular" mapping.
        // Add entry to map.
        if (Device.getTgtPtrBegin(CurrHostEntry->addr, CurrHostEntry->size))
          continue;
        DP("Add mapping from host " DPxMOD " to device " DPxMOD " with size %zu"
            "\n", DPxPTR(CurrHostEntry->addr), DPxPTR(CurrDeviceEntry->addr),
            CurrDeviceEntry->size);
        Device.HostDataToTargetMap.push_front(HostDataToTargetTy(
            (uintptr_t)CurrHostEntry->addr /*HstPtrBase*/,
            (uintptr_t)CurrHostEntry->addr /*HstPtrBegin*/,
            (uintptr_t)CurrHostEntry->addr + CurrHostEntry->size /*HstPtrEnd*/,
            (uintptr_t)CurrDeviceEntry->addr /*TgtPtrBegin*/,
            INF_REF_CNT /*RefCount*/));
      }
    }
    Device.DataMapMtx.unlock();
  }
  TrlTblMtx.unlock();

  if (rc != OFFLOAD_SUCCESS) {
    Device.PendingGlobalsMtx.unlock();
    return rc;
  }

  /*
   * Run ctors for static objects
   */
  if (!Device.PendingCtorsDtors.empty()) {
    // Call all ctors for all libraries registered so far
    for (auto &lib : Device.PendingCtorsDtors) {
      if (!lib.second.PendingCtors.empty()) {
        DP("Has pending ctors... call now\n");
        for (auto &entry : lib.second.PendingCtors) {
          void *ctor = entry;
          int rc = target(device_id, ctor, 0, NULL, NULL, NULL,
                          NULL, 1, 1, true /*team*/);
          if (rc != OFFLOAD_SUCCESS) {
            DP("Running ctor " DPxMOD " failed.\n", DPxPTR(ctor));
            Device.PendingGlobalsMtx.unlock();
            return OFFLOAD_FAIL;
          }
        }
        // Clear the list to indicate that this device has been used
        lib.second.PendingCtors.clear();
        DP("Done with pending ctors for lib " DPxMOD "\n", DPxPTR(lib.first));
      }
    }
  }
  Device.HasPendingGlobals = false;
  Device.PendingGlobalsMtx.unlock();

  return OFFLOAD_SUCCESS;
}